

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat __thiscall Mat::DirectProduct(Mat *this,Mat *rhs)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int *in_RDX;
  double *extraout_RDX;
  double *extraout_RDX_00;
  Mat MVar4;
  int n;
  int m;
  int jn;
  int in;
  int jm;
  int im;
  Mat *rhs_local;
  Mat *this_local;
  Mat *product;
  
  Mat(this,rhs->n_rows_ * *in_RDX,rhs->n_cols_ * in_RDX[1]);
  pdVar3 = extraout_RDX;
  for (in = 0; in < rhs->n_rows_; in = in + 1) {
    for (jn = 0; jn < rhs->n_cols_; jn = jn + 1) {
      for (m = 0; m < *in_RDX; m = m + 1) {
        for (n = 0; n < in_RDX[1]; n = n + 1) {
          dVar1 = rhs->v_[in * rhs->n_cols_ + jn];
          dVar2 = *(double *)(*(long *)(in_RDX + 2) + (long)(m * in_RDX[1] + n) * 8);
          pdVar3 = operator()(this,in * *in_RDX + m,jn * in_RDX[1] + n);
          *pdVar3 = dVar1 * dVar2;
          pdVar3 = extraout_RDX_00;
        }
      }
    }
  }
  MVar4.v_ = pdVar3;
  MVar4._0_8_ = this;
  return MVar4;
}

Assistant:

Mat Mat::DirectProduct(const Mat &rhs) const
{
	Mat product(n_rows_*rhs.n_rows_, n_cols_*rhs.n_cols_);
	for (int im = 0; im < n_rows_ ; im++ )
	{
		for (int jm=0; jm<n_cols_; jm++)
		{
			for (int in=0; in<rhs.n_rows_ ; in++ )
			{
				for (int jn=0; jn<rhs.n_cols_; jn++)
				{
					int m = im*rhs.n_rows_ +in;
					int n = jm*rhs.n_cols_+ jn;
					product( m , n) = v_[im*n_cols_+jm] *  rhs.v_[in*rhs.n_cols_+jn];
				}
			}
		} 
	}
	return product;
}